

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

void duckdb::URLEncodeInternal<duckdb::URLEncodeLength>
               (char *input,idx_t input_size,RESULT_TYPE *result,bool encode_slash)

{
  byte bVar1;
  RESULT_TYPE RVar2;
  idx_t i;
  idx_t iVar3;
  long lVar4;
  
  RVar2 = *result;
  for (iVar3 = 0; input_size != iVar3; iVar3 = iVar3 + 1) {
    bVar1 = input[iVar3];
    lVar4 = 1;
    if (((9 < (byte)(bVar1 - 0x30)) && (lVar4 = 1, 0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
       (lVar4 = 1, 1 < bVar1 - 0x2d)) {
      lVar4 = 1;
      if (((bVar1 != 0x7e) && (lVar4 = 1, bVar1 != 0x5f)) &&
         ((bVar1 != 0x2f || (lVar4 = 1, encode_slash)))) {
        lVar4 = 3;
      }
    }
    RVar2 = RVar2 + lVar4;
    *result = RVar2;
  }
  return;
}

Assistant:

void URLEncodeInternal(const char *input, idx_t input_size, typename OP::RESULT_TYPE &result, bool encode_slash) {
	// https://docs.aws.amazon.com/AmazonS3/latest/API/sigv4-query-string-auth.html
	static const char *HEX_DIGIT = "0123456789ABCDEF";
	for (idx_t i = 0; i < input_size; i++) {
		char ch = input[i];
		if ((ch >= 'A' && ch <= 'Z') || (ch >= 'a' && ch <= 'z') || (ch >= '0' && ch <= '9') || ch == '_' ||
		    ch == '-' || ch == '~' || ch == '.') {
			OP::ProcessCharacter(result, ch);
		} else if (ch == '/' && !encode_slash) {
			OP::ProcessCharacter(result, ch);
		} else {
			OP::ProcessCharacter(result, '%');
			OP::ProcessCharacter(result, HEX_DIGIT[static_cast<unsigned char>(ch) >> 4]);
			OP::ProcessCharacter(result, HEX_DIGIT[static_cast<unsigned char>(ch) & 15]);
		}
	}
}